

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O1

BigNumber * operator/(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2)

{
  pointer puVar1;
  unsigned_long uVar2;
  iterator __position;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  BigNumber val;
  value_type local_19c;
  BigNumber local_198;
  ulong local_178;
  BigNumber *local_170;
  BigNumber *local_168;
  ulong local_160;
  ulong local_158;
  BigNumber local_150;
  BigNumber local_130;
  BigNumber local_110;
  BigNumber local_f0;
  BigNumber local_d0;
  BigNumber local_b0;
  BigNumber local_90;
  BigNumber local_70;
  BigNumber local_50;
  
  uVar2 = nb1->m_base;
  Polynome::Polynome(&__return_storage_ptr__->super_Polynome);
  __return_storage_ptr__->m_base = uVar2;
  uVar4 = (uint)((ulong)((long)(nb2->super_Polynome).m_coef.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(nb2->super_Polynome).m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_170 = __return_storage_ptr__;
  local_168 = nb1;
  BigNumber::m_slice(&local_198,nb1,
                     (int)((ulong)((long)(nb1->super_Polynome).m_coef.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(nb1->super_Polynome).m_coef.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) - uVar4,
                     uVar4);
  bVar3 = operator>(nb2,&local_198);
  if (bVar3) {
    local_19c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
               (const_iterator)
               local_198.super_Polynome.m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,&local_19c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198);
    local_110.m_base = local_198.m_base;
    BigNumber::m_slice(&local_50,local_168,
                       ~(uint)((ulong)((long)(nb2->super_Polynome).m_coef.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(nb2->super_Polynome).m_coef.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) +
                       (int)((ulong)((long)(local_168->super_Polynome).m_coef.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_168->super_Polynome).m_coef.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2),1);
    operator+(&local_f0,&local_110,&local_50);
    local_198.m_base = local_f0.m_base;
    if (local_198.super_Polynome.m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_198.super_Polynome.m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_198.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_198.super_Polynome.m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
    if (local_f0.super_Polynome.m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.super_Polynome.m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_50.super_Polynome.m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super_Polynome.m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_110.super_Polynome.m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.super_Polynome.m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  uVar4 = (int)((ulong)((long)(local_168->super_Polynome).m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_168->super_Polynome).m_coef.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2) -
          (int)((ulong)((long)local_198.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_198.super_Polynome.m_coef.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2);
  uVar6 = (ulong)uVar4;
  local_178 = uVar6;
  if (uVar4 != 0) {
    do {
      local_19c = 0;
      __position._M_current =
           (local_170->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_170->super_Polynome).m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_170,__position,
                   (int *)&local_19c);
      }
      else {
        *__position._M_current = 0;
        (local_170->super_Polynome).m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar4 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 0);
  }
  uVar4 = (int)local_178 + 1;
  if (uVar4 == 0) {
LAB_00104648:
    if (local_198.super_Polynome.m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_198.super_Polynome.m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super_Polynome.m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return local_170;
  }
  local_160 = (ulong)uVar4;
  uVar6 = 0;
LAB_00104453:
  iVar5 = (int)local_178;
  local_158 = uVar6;
LAB_00104462:
  bVar3 = operator>(&local_198,nb2);
  if (!bVar3) {
    bVar3 = operator==(&local_198,nb2);
    if (!bVar3) goto LAB_00104555;
  }
  puVar1 = (local_170->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + (uint)(iVar5 - (int)uVar6);
  *puVar1 = *puVar1 + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198);
  local_90.m_base = local_198.m_base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2);
  local_b0.m_base = nb2->m_base;
  operator-(&local_70,&local_90,&local_b0);
  local_198.m_base = local_70.m_base;
  if (local_198.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_198.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_198.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_198.super_Polynome.m_coef.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
  if (local_70.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  goto LAB_00104462;
LAB_00104555:
  local_19c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
             (const_iterator)
             local_198.super_Polynome.m_coef.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,&local_19c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198);
  uVar6 = local_158;
  local_150.m_base = local_198.m_base;
  BigNumber::m_slice(&local_d0,local_168,~(uint)local_158 + (int)local_178,1);
  operator+(&local_130,&local_150,&local_d0);
  local_198.m_base = local_130.m_base;
  if (local_198.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_198.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_198.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_198.super_Polynome.m_coef.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130);
  if (local_130.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar6 = uVar6 + 1;
  if (uVar6 == local_160) goto LAB_00104648;
  goto LAB_00104453;
}

Assistant:

BigNumber operator / (BigNumber nb1, BigNumber nb2) {
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();

    BigNumber quotient(nb1.m_base);
    BigNumber val = nb1.m_slice(nb1.m_degre() - nb2.m_degre(), nb2.m_degre());

    if(nb2 > val){
        val >> 1;
        val = val + nb1.m_slice(nb1.m_degre() - nb2.m_degre() - 1, 1);
    }

    unsigned int quotient_size = nb1.m_degre() - val.m_degre();

    for(unsigned int i = 0; i < quotient_size; i++){
        quotient.m_coef.emplace_back(0);
    }

    for(unsigned int i = 0; i < quotient_size + 1; i++){
        while(val >= nb2){
            quotient.m_coef[quotient_size - i] += 1;
            val = val - nb2;
        }
        val >> 1;
        val = val + nb1.m_slice(quotient_size - i - 1, 1);
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Division : " << (t2 - t1)/(float)cmp << endl;
    return quotient;
}